

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O2

void __thiscall Annotations::GenerateList(Annotations *this)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  sqlite3_stmt *stmt;
  Annotation ann;
  char sql [77];
  
  pcVar3 = "SELECT id,side,posx,posy,net,part,pin,note from annotations where visible=1;";
  pcVar5 = sql;
  for (lVar4 = 0x4d; lVar4 != 0; lVar4 = lVar4 + -1) {
    *pcVar5 = *pcVar3;
    pcVar3 = pcVar3 + 1;
    pcVar5 = pcVar5 + 1;
  }
  iVar1 = sqlite3_prepare_v2(this->sqldb,sql,0xffffffffffffffff,&stmt,0);
  if (iVar1 == 0) {
    std::vector<Annotation,_std::allocator<Annotation>_>::clear(&this->annotations);
    while (iVar1 = sqlite3_step(stmt), iVar1 == 100) {
      ann.note._M_dataplus._M_p = (pointer)&ann.note.field_2;
      ann.note._M_string_length = 0;
      ann.note.field_2._M_local_buf[0] = '\0';
      ann.net._M_dataplus._M_p = (pointer)&ann.net.field_2;
      ann.net._M_string_length = 0;
      ann.net.field_2._M_local_buf[0] = '\0';
      ann.part._M_dataplus._M_p = (pointer)&ann.part.field_2;
      ann.part._M_string_length = 0;
      ann.part.field_2._M_local_buf[0] = '\0';
      ann.pin._M_dataplus._M_p = (pointer)&ann.pin.field_2;
      ann.pin._M_string_length = 0;
      ann.pin.field_2._M_local_buf[0] = '\0';
      ann.id = sqlite3_column_int(stmt,0);
      ann.side = sqlite3_column_int(stmt,1);
      iVar1 = sqlite3_column_int(stmt,2);
      ann.x = (double)iVar1;
      iVar1 = sqlite3_column_int(stmt,3);
      ann.y = (double)iVar1;
      ann.hovered = false;
      sqlite3_column_text(stmt,4);
      std::__cxx11::string::assign((char *)&ann.net);
      sqlite3_column_text(stmt,5);
      std::__cxx11::string::assign((char *)&ann.part);
      sqlite3_column_text(stmt,6);
      std::__cxx11::string::assign((char *)&ann.pin);
      sqlite3_column_text(stmt,7);
      std::__cxx11::string::assign((char *)&ann.note);
      if (this->debug == true) {
        fprintf(_stderr,"%d(%d:%f,%f) Net:%s Part:%s Pin:%s: Note:%s\nAdded\n",ann.x,ann.y,
                (ulong)(uint)ann.id,(ulong)(uint)ann.side,ann.net._M_dataplus._M_p,
                ann.part._M_dataplus._M_p,ann.pin._M_dataplus._M_p,ann.note._M_dataplus._M_p);
      }
      std::vector<Annotation,_std::allocator<Annotation>_>::push_back(&this->annotations,&ann);
      Annotation::~Annotation(&ann);
    }
    if ((iVar1 != 0x65) && (this->debug == true)) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"SELECT failed: ");
      pcVar3 = (char *)sqlite3_errmsg(this->sqldb);
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    sqlite3_finalize(stmt);
  }
  else if (this->debug == true) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"SELECT failed: ");
    pcVar3 = (char *)sqlite3_errmsg(this->sqldb);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return;
}

Assistant:

void Annotations::GenerateList(void) {
	sqlite3_stmt *stmt;
	char sql[] = "SELECT id,side,posx,posy,net,part,pin,note from annotations where visible=1;";
	int rc;

	rc = sqlite3_prepare_v2(sqldb, sql, -1, &stmt, NULL);
	if (rc != SQLITE_OK) {
		if (debug) std::cerr << "SELECT failed: " << sqlite3_errmsg(sqldb) << std::endl;
		return; // or throw
	}

	annotations.clear();
	while ((rc = sqlite3_step(stmt)) == SQLITE_ROW) {
		Annotation ann;
		ann.id      = sqlite3_column_int(stmt, 0);
		ann.side    = sqlite3_column_int(stmt, 1);
		ann.x       = sqlite3_column_int(stmt, 2);
		ann.y       = sqlite3_column_int(stmt, 3);
		ann.hovered = false;

		const char *p = reinterpret_cast<const char *>(sqlite3_column_text(stmt, 4));
		if (!p) p     = "";
		ann.net       = p;

		p         = reinterpret_cast<const char *>(sqlite3_column_text(stmt, 5));
		if (!p) p = "";
		ann.part  = p;

		p         = reinterpret_cast<const char *>(sqlite3_column_text(stmt, 6));
		if (!p) p = "";
		ann.pin   = p;

		p         = reinterpret_cast<const char *>(sqlite3_column_text(stmt, 7));
		if (!p) p = "";
		ann.note  = p;

		if (debug)
			fprintf(stderr,
			        "%d(%d:%f,%f) Net:%s Part:%s Pin:%s: Note:%s\nAdded\n",
			        ann.id,
			        ann.side,
			        ann.x,
			        ann.y,
			        ann.net.c_str(),
			        ann.part.c_str(),
			        ann.pin.c_str(),
			        ann.note.c_str());

		annotations.push_back(ann);
	}
	if (rc != SQLITE_DONE) {
		if (debug) std::cerr << "SELECT failed: " << sqlite3_errmsg(sqldb) << std::endl;
		// if you return/throw here, don't forget the finalize
	}
	sqlite3_finalize(stmt);
}